

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int clone_bbs(gen_ctx_t gen_ctx)

{
  bitmap_t pVVar1;
  bb_insn_t_conflict *ppbVar2;
  char cVar3;
  uint uVar4;
  out_edge_t peVar5;
  VARR_char *pVVar6;
  bb_t pbVar7;
  VARR_size_t *pVVar8;
  void *pvVar9;
  undefined8 uVar10;
  def_tab_el_t el;
  void *__ptr;
  anon_union_8_10_166bea1d_for_u func;
  int iVar11;
  bb_t_conflict *ppbVar12;
  MIR_insn_t_conflict pMVar13;
  gen_ctx_t pgVar14;
  MIR_context_t pMVar15;
  MIR_item_t pMVar16;
  gen_ctx_t pgVar17;
  VARR_bb_t *pVVar18;
  bb_insn_t_conflict pbVar19;
  ulong uVar20;
  bb_insn_t_conflict *ppbVar21;
  bb_t_conflict pbVar22;
  bb_insn_t pbVar23;
  ssa_ctx *psVar24;
  VARR_bb_insn_t *pVVar25;
  func_cfg_t pfVar26;
  func_cfg_t extraout_RAX;
  long extraout_RAX_00;
  bb_t_conflict extraout_RAX_01;
  uint uVar27;
  MIR_context_t pMVar28;
  size_t sVar29;
  long *extraout_RDX;
  size_t sVar30;
  gen_ctx_t gen_ctx_00;
  MIR_insn_t_conflict pMVar31;
  gen_ctx_t pgVar32;
  uint *puVar33;
  MIR_insn_t pMVar34;
  char *pcVar35;
  bitmap_t pVVar36;
  gen_ctx_t pgVar37;
  ulong uVar38;
  long lVar39;
  bitmap_t pVVar40;
  bb_t pbVar41;
  gen_ctx_t pgVar42;
  ulong nop;
  gen_ctx_t pgVar43;
  char *pcVar44;
  gen_ctx_t pgVar45;
  undefined8 *puVar46;
  bool bVar47;
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  int iStackY_244;
  bb_t_conflict pbStackY_240;
  bb_insn_t pbStackY_238;
  gen_ctx_t pgStackY_230;
  gen_ctx_t pgStackY_220;
  gen_ctx_t pgStackY_218;
  gen_ctx_t pgStackY_210;
  gen_ctx_t pgStackY_208;
  gen_ctx_t pgStackY_200;
  gen_ctx_t pgStackY_1f8;
  gen_ctx_t pgStackY_1f0;
  gen_ctx_t pgStackY_1e8;
  gen_ctx_t pgStackY_1e0;
  gen_ctx_t pgStackY_1d8;
  long lStack_198;
  undefined1 auStack_190 [40];
  int iStack_168;
  undefined1 auStack_164 [20];
  bitmap_t pVStack_150;
  gen_ctx_t pgStack_148;
  gen_ctx_t pgStack_140;
  gen_ctx_t pgStack_138;
  gen_ctx_t pgStack_130;
  gen_ctx_t pgStack_128;
  gen_ctx_t pgStack_120;
  gen_ctx_t pgStack_118;
  gen_ctx_t pgStack_110;
  bitmap_t pVStack_108;
  bitmap_t pVStack_100;
  target_ctx *local_f8;
  bitmap_t pVStack_f0;
  ssa_ctx *psStack_e8;
  gvn_ctx *pgStack_e0;
  gen_ctx_t local_d8;
  gen_ctx_t local_d0;
  MIR_context_t local_c8;
  MIR_context_t local_c0;
  gen_ctx_t local_b8;
  anon_union_8_10_166bea1d_for_u local_b0;
  gen_ctx_t local_a8;
  bitmap_t local_a0;
  bitmap_t local_98;
  bitmap_t pVStack_90;
  target_ctx *ptStack_88;
  bitmap_t pVStack_80;
  ssa_ctx *psStack_78;
  gvn_ctx *pgStack_70;
  bitmap_t local_68;
  bitmap_t pVStack_60;
  target_ctx *ptStack_58;
  bitmap_t pVStack_50;
  ssa_ctx *psStack_48;
  gvn_ctx *pgStack_40;
  
  if (gen_ctx->optimize_level != 0) {
    pVVar40 = gen_ctx->temp_bitmap;
    if ((pVVar40 != (bitmap_t)0x0) && (pVVar40->varr != (bitmap_el_t *)0x0)) {
      local_c0 = gen_ctx->ctx;
      local_b0 = gen_ctx->curr_func_item->u;
      pVVar40->els_num = 0;
      pbVar22 = (gen_ctx->curr_cfg->bbs).head;
      local_d0 = gen_ctx;
      do {
        if (pbVar22 == (bb_t_conflict)0x0) {
          return 0;
        }
        uVar20 = pbVar22->index;
        pVVar40 = local_d0->temp_bitmap;
        pgStack_110 = (gen_ctx_t)0x154d02;
        bitmap_expand(pVVar40,uVar20 + 1);
        if (pVVar40 == (bitmap_t)0x0) {
          pgStack_110 = (gen_ctx_t)0x155522;
          clone_bbs_cold_14();
LAB_00155522:
          pgStack_110 = (gen_ctx_t)0x155541;
          __assert_fail("(DLIST_out_edge_t_next (e)) == ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x7ed,"int clone_bbs(gen_ctx_t)");
        }
        pVVar40->varr[uVar20 >> 6] = pVVar40->varr[uVar20 >> 6] | 1L << (uVar20 & 0x3f);
        pbVar23 = (pbVar22->bb_insns).tail;
        if ((pbVar23 != (bb_insn_t)0x0) && (*(int *)&pbVar23->insn->field_0x18 - 0xabU < 2)) {
          pVVar18 = local_d0->data_flow_ctx->worklist;
          if ((pVVar18 != (VARR_bb_t *)0x0) && (pVVar18->varr != (bb_t_conflict *)0x0)) {
            pVVar18->els_num = 0;
            pbVar22 = (pbVar22->bb_link).next;
            pgVar17 = local_d0;
            if (pbVar22 != (bb_t_conflict)0x0) goto LAB_00154d80;
            goto LAB_00154e54;
          }
          pgStack_110 = (gen_ctx_t)0x1555b7;
          clone_bbs_cold_13();
          goto LAB_001555b7;
        }
        pbVar22 = (pbVar22->bb_link).next;
      } while( true );
    }
LAB_00155589:
    pgStack_110 = (gen_ctx_t)0x15558e;
    clone_bbs_cold_15();
LAB_0015558e:
    pgStack_110 = (gen_ctx_t)0x155593;
    clone_bbs_cold_2();
  }
  pgStack_110 = (gen_ctx_t)0x1555b2;
  __assert_fail("gen_ctx->optimize_level != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x7d3,"int clone_bbs(gen_ctx_t)");
LAB_001555b7:
  pgStack_110 = (gen_ctx_t)0x1555bc;
  clone_bbs_cold_1();
  goto LAB_001555bc;
LAB_00154f3b:
  local_a8 = pgVar14;
  local_a0 = pVVar40;
  if (((FILE *)pgVar17->debug_file != (FILE *)0x0) && (1 < pgVar17->debug_level)) {
    pgStack_110 = (gen_ctx_t)0x154f69;
    fprintf((FILE *)pgVar17->debug_file,"  Cloning from BB%lu into BB%lu:\n",*puVar46,pgVar42->ctx);
    pMVar34 = pbVar23->insn;
    local_c8 = *(MIR_context_t *)puVar46[0xb];
  }
  pgVar14 = (gen_ctx_t)(pMVar34->insn_link).prev;
  local_b8 = (gen_ctx_t)&pgVar42->temp_bitmap;
  pgStack_110 = (gen_ctx_t)0x154f8f;
  gen_delete_insn(pgVar17,pMVar34);
  pMVar15 = local_c0;
  for (puVar46 = (undefined8 *)puVar46[10]; local_c0 = pMVar15, puVar46 != (undefined8 *)0x0;
      puVar46 = (undefined8 *)puVar46[5]) {
    if (*(int *)&((MIR_insn_t_conflict)*puVar46)->field_0x18 != 0xb4) {
      pgStack_110 = (gen_ctx_t)0x154fc8;
      local_d8 = pgVar14;
      pgVar14 = (gen_ctx_t)MIR_copy_insn(pMVar15,(MIR_insn_t_conflict)*puVar46);
      pgStack_110 = (gen_ctx_t)0x154fe2;
      MIR_insert_insn_after
                (pMVar15,pgVar17->curr_func_item,(MIR_insn_t_conflict)local_d8,
                 (MIR_insn_t_conflict)pgVar14);
      pgStack_110 = (gen_ctx_t)0x154ff0;
      pbVar19 = create_bb_insn(pgVar17,(MIR_insn_t)pgVar14,(bb_t_conflict)pgVar42);
      pgStack_110 = (gen_ctx_t)0x154ffd;
      DLIST_bb_insn_t_append((DLIST_bb_insn_t *)local_b8,pbVar19);
      if (((FILE *)pgVar17->debug_file != (FILE *)0x0) && (1 < pgVar17->debug_level)) {
        pgStack_110 = (gen_ctx_t)0x155021;
        fprintf((FILE *)pgVar17->debug_file,"  Adding insn %-5lu",
                (ulong)*(uint *)((long)&pgVar14->ctx->c2mir_ctx + 4));
        pgStack_110 = (gen_ctx_t)0x15503d;
        MIR_output_insn(local_c0,pgVar17->debug_file,(MIR_insn_t_conflict)pgVar14,local_b0.func,1);
      }
      pcVar44 = (char *)((long)&((gen_ctx_t)pcVar44)->ctx + 1);
    }
    pMVar15 = local_c0;
  }
  pgStack_110 = (gen_ctx_t)0x155058;
  delete_edge((edge_t_conflict)pgVar32);
  pMVar15 = local_c0;
  if (local_c8 == (MIR_context_t)0x0) goto LAB_001555c6;
  if (local_c8->func_redef_permission_p - 0x77U < 0x2e) {
    pMVar31 = (MIR_insn_t_conflict)local_c8->error_func;
    local_d8 = pgVar14;
    if (*(int *)&pMVar31->field_0x18 != 0xb4) {
      pMVar15 = pgVar17->ctx;
      pgStack_110 = (gen_ctx_t)0x15509d;
      pMVar13 = MIR_new_label(pMVar15);
      pgStack_110 = (gen_ctx_t)0x1550b2;
      MIR_insert_insn_before(pMVar15,pgVar17->curr_func_item,pMVar31,pMVar13);
      pgStack_110 = (gen_ctx_t)0x1550c6;
      add_new_bb_insn(pgVar17,pMVar13,*(bb_t_conflict *)((long)pMVar31->data + 0x30),0);
      pMVar31 = pMVar13;
    }
    pMVar15 = local_c0;
    pgStack_110 = (gen_ctx_t)0x1550de;
    MIR_new_label_op(local_c0,pMVar31);
    psStack_e8 = psStack_78;
    pgStack_e0 = pgStack_70;
    pVStack_108 = local_98;
    pVStack_100 = pVStack_90;
    local_f8 = ptStack_88;
    pVStack_f0 = pVStack_80;
    pgStack_110 = (gen_ctx_t)0x15510a;
    pMVar13 = MIR_new_insn(pMVar15,MIR_JMP);
    pgStack_110 = (gen_ctx_t)0x155121;
    MIR_insert_insn_after(pMVar15,pgVar17->curr_func_item,(MIR_insn_t_conflict)local_d8,pMVar13);
    pgStack_110 = (gen_ctx_t)0x15512c;
    pgVar14 = (gen_ctx_t)create_bb(pgVar17,pMVar13);
    pgStack_110 = (gen_ctx_t)0x15513d;
    insert_new_bb_after(pgVar17,(bb_t_conflict)pgVar42,(bb_t_conflict)pgVar14);
    pVVar40 = pgVar17->temp_bitmap;
    if (pVVar40 == (bitmap_t)0x0) {
      pgStack_110 = (gen_ctx_t)0x1555ea;
      clone_bbs_cold_6();
LAB_001555ea:
      pgStack_110 = (gen_ctx_t)0x1555ef;
      clone_bbs_cold_5();
LAB_001555ef:
      pgStack_110 = (gen_ctx_t)0x1555f4;
      clone_bbs_cold_8();
LAB_001555f4:
      pgStack_110 = (gen_ctx_t)0x155613;
      __assert_fail("next_insn->code == MIR_LABEL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x819,"int clone_bbs(gen_ctx_t)");
    }
    uVar20 = **(ulong **)((long)pMVar31->data + 0x30);
    if ((uVar20 < pVVar40->els_num << 6) &&
       ((pVVar40->varr[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)) {
      pVVar18 = pgVar17->data_flow_ctx->worklist;
      ppbVar12 = pVVar18->varr;
      if (ppbVar12 == (bb_t_conflict *)0x0) goto LAB_001555ea;
      sVar30 = pVVar18->els_num;
      uVar20 = sVar30 + 1;
      if (pVVar18->size < uVar20) {
        sVar30 = (uVar20 >> 1) + uVar20;
        pgStack_110 = (gen_ctx_t)0x1551b6;
        ppbVar12 = (bb_t_conflict *)realloc(ppbVar12,sVar30 * 8);
        pVVar18->varr = ppbVar12;
        pVVar18->size = sVar30;
        sVar30 = pVVar18->els_num;
        uVar20 = sVar30 + 1;
        pgVar17 = local_d0;
      }
      pVVar18->els_num = uVar20;
      ppbVar12[sVar30] = (bb_t_conflict)pgVar14;
    }
    pgStack_110 = (gen_ctx_t)0x1551ea;
    create_edge(pgVar17,(bb_t_conflict)pgVar42,(bb_t_conflict)pgVar14,1,1);
    pgStack_110 = (gen_ctx_t)0x15520d;
    create_edge(pgVar17,(bb_t_conflict)pgVar42,
                *(bb_t_conflict *)(local_c8->temp_string->els_num + 0x30),0,1);
    pMVar15 = (MIR_context_t)pMVar31->data;
  }
  else {
    if (local_c8->func_redef_permission_p == 0x76) {
      pVVar6 = local_c8->temp_string;
      pgStack_110 = (gen_ctx_t)0x155310;
      pcVar35 = (char *)pgVar42;
      gen_ctx_00 = pgVar17;
      create_edge(pgVar17,(bb_t_conflict)pgVar42,*(bb_t_conflict *)(pVVar6->els_num + 0x30),0,1);
      pVVar40 = pgVar17->temp_bitmap;
      if (pVVar40 != (bitmap_t)0x0) {
        uVar27 = *(uint *)(pVVar6->els_num + 0xc);
        pgVar17 = local_d0;
        if ((pVVar40->els_num << 6 <= (ulong)uVar27) ||
           ((pVVar40->varr[uVar27 >> 6] >> ((ulong)uVar27 & 0x3f) & 1) == 0)) goto LAB_00155228;
        pgVar37 = (gen_ctx_t)local_d0->data_flow_ctx->worklist;
        pMVar16 = pgVar37->curr_func_item;
        pgVar43 = pgVar14;
        pgVar14 = pgVar37;
        if (pMVar16 != (MIR_item_t)0x0) {
          pMVar28 = pgVar37->ctx;
          pMVar15 = (MIR_context_t)((long)&pMVar28->gen_ctx + 1);
          if (*(MIR_context_t *)&pgVar37->optimize_level < pMVar15) {
            pcVar35 = (char *)((long)&pMVar15->gen_ctx + ((ulong)pMVar15 >> 1));
            pgStack_110 = (gen_ctx_t)0x15538c;
            pMVar16 = (MIR_item_t)realloc(pMVar16,(long)pcVar35 * 8);
            pgVar37->curr_func_item = pMVar16;
            *(char **)&pgVar37->optimize_level = pcVar35;
            pMVar28 = pgVar37->ctx;
            pMVar15 = (MIR_context_t)((long)&pMVar28->gen_ctx + 1);
          }
          pgVar37->ctx = pMVar15;
          (&pMVar16->data)[(long)pMVar28] = pgVar42;
          pgVar17 = local_d0;
          goto LAB_00155228;
        }
LAB_00155618:
        pgStack_110 = (gen_ctx_t)0x15561d;
        clone_bbs_cold_7();
LAB_0015561d:
        pgStack_110 = (gen_ctx_t)build_ssa;
        clone_bbs_cold_9();
        psVar24 = gen_ctx_00->ssa_ctx;
        pgVar37 = gen_ctx_00;
        pgStack_138 = pgVar17;
        pgStack_130 = pgVar42;
        pgStack_128 = pgVar43;
        pgStack_120 = pgVar14;
        pgStack_118 = (gen_ctx_t)pcVar44;
        pgStack_110 = pgVar32;
        if (psVar24->arg_bb_insns == (VARR_bb_insn_t *)0x0) goto LAB_0015637d;
        if (psVar24->arg_bb_insns->els_num != 0) goto LAB_0015634f;
        if (psVar24->undef_insns == (VARR_bb_insn_t *)0x0) goto LAB_00156382;
        if (psVar24->undef_insns->els_num != 0) goto LAB_0015634f;
        pgVar37 = (gen_ctx_t)psVar24->def_tab;
        iStack_168 = (int)pcVar35;
        pgStackY_1d8 = (gen_ctx_t)0x155677;
        HTAB_def_tab_el_t_clear((HTAB_def_tab_el_t *)pgVar37);
        pVVar18 = gen_ctx_00->data_flow_ctx->worklist;
        if ((pVVar18 != (VARR_bb_t *)0x0) && (pVVar18->varr != (bb_t_conflict *)0x0)) {
          pVVar18->els_num = 0;
          pgVar14 = (gen_ctx_t)(gen_ctx_00->curr_cfg->bbs).head;
          if (pgVar14 != (gen_ctx_t)0x0) goto LAB_001556ac;
          goto LAB_0015571b;
        }
        pgStackY_1d8 = (gen_ctx_t)0x156373;
        build_ssa_cold_22();
        goto LAB_00156373;
      }
      goto LAB_001555ef;
    }
    pgVar32 = (gen_ctx_t)local_c8->error_func;
    if (*(int *)&pgVar32->debug_file != 0xb4) goto LAB_001555f4;
    local_c8 = pgVar32->ctx;
    pgStack_110 = (gen_ctx_t)0x1553e5;
    local_d8 = pgVar32;
    MIR_new_label_op(local_c0,(MIR_label_t)pgVar32);
    psStack_e8 = psStack_48;
    pgStack_e0 = pgStack_40;
    pVStack_108 = local_68;
    pVStack_100 = pVStack_60;
    local_f8 = ptStack_58;
    pVStack_f0 = pVStack_50;
    pgStack_110 = (gen_ctx_t)0x155414;
    pgVar43 = (gen_ctx_t)MIR_new_insn(pMVar15,MIR_JMP);
    pgStack_110 = (gen_ctx_t)0x15542c;
    MIR_insert_insn_after
              (pMVar15,pgVar17->curr_func_item,(MIR_insn_t_conflict)pgVar14,
               (MIR_insn_t_conflict)pgVar43);
    pgStack_110 = (gen_ctx_t)0x15543a;
    pcVar35 = (char *)create_bb_insn(pgVar17,(MIR_insn_t)pgVar43,(bb_t_conflict)pgVar42);
    pgStack_110 = (gen_ctx_t)0x155447;
    gen_ctx_00 = local_b8;
    DLIST_bb_insn_t_append((DLIST_bb_insn_t *)local_b8,(bb_insn_t_conflict)pcVar35);
    pVVar40 = pgVar17->temp_bitmap;
    pgVar32 = pgVar17;
    if (pVVar40 == (bitmap_t)0x0) {
      pgStack_110 = (gen_ctx_t)0x155618;
      clone_bbs_cold_11();
      goto LAB_00155618;
    }
    uVar27 = *(uint *)((long)&local_c8->c2mir_ctx + 4);
    if (((ulong)uVar27 < pVVar40->els_num << 6) &&
       ((pVVar40->varr[uVar27 >> 6] >> ((ulong)uVar27 & 0x3f) & 1) != 0)) {
      pgVar14 = (gen_ctx_t)pgVar17->data_flow_ctx->worklist;
      pMVar16 = pgVar14->curr_func_item;
      if (pMVar16 == (MIR_item_t)0x0) goto LAB_0015561d;
      pMVar28 = pgVar14->ctx;
      pMVar15 = (MIR_context_t)((long)&pMVar28->gen_ctx + 1);
      if (*(MIR_context_t *)&pgVar14->optimize_level < pMVar15) {
        pcVar35 = (char *)((long)&pMVar15->gen_ctx + ((ulong)pMVar15 >> 1));
        pgStack_110 = (gen_ctx_t)0x1554b8;
        pMVar16 = (MIR_item_t)realloc(pMVar16,(long)pcVar35 * 8);
        pgVar14->curr_func_item = pMVar16;
        *(char **)&pgVar14->optimize_level = pcVar35;
        pMVar28 = pgVar14->ctx;
        pMVar15 = (MIR_context_t)((long)&pMVar28->gen_ctx + 1);
        pgVar17 = local_d0;
      }
      pgVar14->ctx = pMVar15;
      (&pMVar16->data)[(long)pMVar28] = pgVar42;
    }
    pMVar15 = local_d8->ctx;
    pgVar14 = pgVar42;
  }
  pgStack_110 = (gen_ctx_t)0x155228;
  create_edge(pgVar17,(bb_t_conflict)pgVar14,(bb_t_conflict)pMVar15->temp_string,0,1);
LAB_00155228:
  func = local_b0;
  pMVar15 = local_c0;
  if (((FILE *)pgVar17->debug_file != (FILE *)0x0) && (1 < pgVar17->debug_level)) {
    pgStack_110 = (gen_ctx_t)0x155256;
    fprintf((FILE *)pgVar17->debug_file,"  Result BB%lu:\n",pgVar42->ctx);
    pgStack_110 = (gen_ctx_t)0x155261;
    output_in_edges(pgVar17,(bb_t_conflict)pgVar42);
    pgStack_110 = (gen_ctx_t)0x15526c;
    output_out_edges(pgVar17,(bb_t_conflict)pgVar42);
    for (pbVar23 = ((DLIST_bb_insn_t *)&pgVar42->temp_bitmap)->head; pbVar23 != (bb_insn_t)0x0;
        pbVar23 = (pbVar23->bb_insn_link).next) {
      pgStack_110 = (gen_ctx_t)0x15528c;
      fprintf((FILE *)pgVar17->debug_file,"  %-5lu",(ulong)pbVar23->index);
      pgStack_110 = (gen_ctx_t)0x1552a4;
      MIR_output_insn(pMVar15,pgVar17->debug_file,pbVar23->insn,func.func,1);
    }
  }
  local_d8 = (gen_ctx_t)CONCAT44(local_d8._4_4_,1);
  bVar47 = false;
  pVVar18 = pgVar17->data_flow_ctx->worklist;
  pVVar40 = local_a0;
  pgVar14 = local_a8;
  if (pVVar18 == (VARR_bb_t *)0x0) goto LAB_001555c1;
  goto LAB_00154e6d;
code_r0x00155c16:
  pVVar25->els_num = (size_t)pcVar44;
  if ((int)pgVar43 == 0) goto code_r0x00155c22;
  goto LAB_00155a50;
code_r0x00155c22:
  pgVar37 = (gen_ctx_t)gen_ctx_00->debug_file;
  if ((pgVar37 != (gen_ctx_t)0x0) && (1 < gen_ctx_00->debug_level)) {
    if (psVar24->deleted_phis == (VARR_bb_insn_t *)0x0) goto LAB_0015639b;
    pcVar35 = "Minimizing SSA phis: from %ld to %ld phis (non-phi insns %ld)\n";
    pgStackY_1d8 = (gen_ctx_t)0x155c5a;
    fprintf((FILE *)pgVar37,"Minimizing SSA phis: from %ld to %ld phis (non-phi insns %ld)\n",
            (long)((gen_ctx_t)pcVar44)->call_used_hard_regs +
            (psVar24->deleted_phis->els_num - 0x68),pcVar44,lStack_198);
  }
  for (pbVar22 = (gen_ctx_00->curr_cfg->bbs).head; pbVar22 != (bb_t_conflict)0x0;
      pbVar22 = (pbVar22->bb_link).next) {
    for (pbVar23 = (pbVar22->bb_insns).head; pbVar23 != (bb_insn_t)0x0;
        pbVar23 = (pbVar23->bb_insn_link).next) {
      pgVar17 = (gen_ctx_t)pbVar23->insn;
      pgVar43 = (gen_ctx_t)((ulong)pgVar17->debug_file >> 0x20);
      if (pgVar43 != (gen_ctx_t)0x0) {
        pgVar42 = (gen_ctx_t)0x0;
        pgVar45 = (gen_ctx_t)0x0;
        do {
          pgVar32 = (gen_ctx_t)(pgVar17->call_used_hard_regs + (long)pgVar42 * 6 + -9);
          pgVar14 = (gen_ctx_t)(pgVar17->call_used_hard_regs + (long)(int)pgVar42 * 6 + -9);
          while( true ) {
            pgVar37 = (gen_ctx_t)gen_ctx_00->ctx;
            pgStackY_1d8 = (gen_ctx_t)0x155ceb;
            pcVar35 = (char *)pgVar17;
            MIR_insn_op_mode((MIR_context_t)pgVar37,(MIR_insn_t_conflict)pgVar17,(size_t)pgVar42,
                             (int *)auStack_190);
            pcVar44 = (char *)pgVar45;
            if ((auStack_190._0_4_ != 0) && (*(char *)&pgVar32->optimize_level != '\v'))
            goto LAB_00155d77;
            if ((gen_ctx_t)&DAT_00000001 < pgVar45) break;
            if (*(char *)&pgVar32->optimize_level == '\v') {
              while (*(int *)((long)pgVar32->call_used_hard_regs +
                             (ulong)(pgVar45 != (gen_ctx_t)0x0) * 4 + -0x48) == -1) {
                bVar47 = pgVar45 != (gen_ctx_t)0x0;
                pgVar45 = (gen_ctx_t)&DAT_00000001;
                pcVar44 = (char *)pgVar45;
                if (bVar47) goto LAB_00155d75;
              }
              pcVar44 = (char *)((long)&pgVar45->ctx + 1);
            }
            else {
              if (pgVar45 == (gen_ctx_t)&DAT_00000001) break;
              pcVar44 = &DAT_00000001;
              pgVar45 = (gen_ctx_t)0x0;
              if (*(char *)&pgVar32->optimize_level != '\x02') goto LAB_00155d77;
            }
            pMVar15 = pgVar14->ctx;
            if (pgVar14->ctx != (MIR_context_t)0x0) {
              do {
                pMVar28 = pMVar15;
                if (*(int *)&pMVar28->gen_ctx->debug_file != 0xba) break;
                pMVar15 = *(MIR_context_t *)&pMVar28->gen_ctx->debug_level;
              } while (pMVar28 != pMVar15);
              pgVar14->ctx = pMVar28;
            }
            pgVar45 = (gen_ctx_t)pcVar44;
            if (pgVar43 <= pgVar42) goto LAB_00155c97;
          }
LAB_00155d75:
          pgVar45 = (gen_ctx_t)0x0;
LAB_00155d77:
          pgVar42 = (gen_ctx_t)((long)&pgVar42->ctx + 1);
        } while (pgVar42 < pgVar43);
      }
LAB_00155c97:
    }
  }
  psVar24 = gen_ctx_00->ssa_ctx;
  pVVar25 = psVar24->deleted_phis;
  if (pVVar25 == (VARR_bb_insn_t *)0x0) {
LAB_0015633b:
    pgStackY_1d8 = (gen_ctx_t)0x156340;
    build_ssa_cold_10();
LAB_00156340:
    pgStackY_1d8 = (gen_ctx_t)0x156345;
    build_ssa_cold_2();
LAB_00156345:
    pgStackY_1d8 = (gen_ctx_t)0x15634a;
    build_ssa_cold_4();
LAB_0015634a:
    pgStackY_1d8 = (gen_ctx_t)0x15634f;
    build_ssa_cold_6();
LAB_0015634f:
    pgStackY_1d8 = (gen_ctx_t)0x15636e;
    __assert_fail("(VARR_bb_insn_tlength (gen_ctx->ssa_ctx->arg_bb_insns)) == 0 && (VARR_bb_insn_tlength (gen_ctx->ssa_ctx->undef_insns)) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xa61,"void build_ssa(gen_ctx_t, int)");
  }
  if (pVVar25->els_num != 0) {
    pgVar14 = (gen_ctx_t)0x0;
    do {
      if (pVVar25->varr == (bb_insn_t_conflict *)0x0) goto LAB_00156345;
      pcVar35 = (char *)pVVar25->varr[(long)pgVar14]->insn;
      pgStackY_1d8 = (gen_ctx_t)0x155dd4;
      pgVar37 = gen_ctx_00;
      gen_delete_insn(gen_ctx_00,(MIR_insn_t)pcVar35);
      psVar24 = gen_ctx_00->ssa_ctx;
      pVVar25 = psVar24->deleted_phis;
      if (pVVar25 == (VARR_bb_insn_t *)0x0) goto LAB_0015633b;
      pgVar14 = (gen_ctx_t)((long)&pgVar14->ctx + 1);
    } while (pgVar14 < (gen_ctx_t)pVVar25->els_num);
  }
  pVVar25 = psVar24->phis;
  if (pVVar25 == (VARR_bb_insn_t *)0x0) {
LAB_00156387:
    pgStackY_1d8 = (gen_ctx_t)0x15638c;
    build_ssa_cold_9();
    goto LAB_0015638c;
  }
  sVar30 = pVVar25->els_num;
  if (sVar30 != 0) {
    ppbVar21 = pVVar25->varr;
    if (ppbVar21 != (bb_insn_t_conflict *)0x0) {
      sVar29 = 0;
      do {
        ppbVar2 = ppbVar21 + sVar29;
        sVar29 = sVar29 + 1;
        pcVar35 = (char *)(*ppbVar2)->insn;
        ((DLIST_LINK_bb_t *)&((gen_ctx_t)pcVar35)->debug_level)->prev = (bb_t)0x0;
      } while (sVar30 != sVar29);
      goto LAB_00155e2b;
    }
    goto LAB_00156391;
  }
LAB_00155e2b:
  pbVar22 = (gen_ctx_00->curr_cfg->bbs).head;
  if (pbVar22 != (bb_t_conflict)0x0) {
    pgVar14 = (gen_ctx_t)auStack_190;
    do {
      pbVar23 = (pbVar22->bb_insns).head;
      auStack_164._12_8_ = pbVar22;
      while (pbVar23 != (bb_insn_t)0x0) {
        pMVar31 = pbVar23->insn;
        pgVar43 = (gen_ctx_t)(*(ulong *)&pMVar31->field_0x18 >> 0x20);
        auStack_164._4_8_ = pbVar23;
        if (pgVar43 != (gen_ctx_t)0x0) {
          pcVar44 = (char *)0x0;
          pgVar32 = (gen_ctx_t)0x0;
          pVStack_150 = (bitmap_t)pMVar31->ops;
          pgStack_148 = pgVar43;
          do {
            pgVar17 = (gen_ctx_t)(pVStack_150 + (long)pgVar32 * 2);
            pVVar40 = pVStack_150 + (long)(int)pgVar32 * 2;
            pgStack_140 = pgVar32;
            while( true ) {
              pgVar37 = (gen_ctx_t)gen_ctx_00->ctx;
              pgStackY_1d8 = (gen_ctx_t)0x155ee4;
              MIR_insn_op_mode((MIR_context_t)pgVar37,pMVar31,(size_t)pgVar32,(int *)pgVar14);
              pcVar35 = (char *)pgVar17;
              if ((auStack_190._0_4_ != 0) && (*(char *)&pgVar17->optimize_level != '\v'))
              goto LAB_00156041;
              if ((gen_ctx_t)&DAT_00000001 < pcVar44) break;
              if (*(char *)&pgVar17->optimize_level == '\v') {
                while (uVar27 = *(uint *)((long)pgVar17->call_used_hard_regs +
                                         (ulong)((gen_ctx_t)pcVar44 != (gen_ctx_t)0x0) * 4 + -0x48),
                      uVar27 == 0xffffffff) {
                  bVar47 = (gen_ctx_t)pcVar44 != (gen_ctx_t)0x0;
                  pcVar44 = &DAT_00000001;
                  if (bVar47) {
                    pcVar44 = (char *)0x0;
                    goto LAB_00156041;
                  }
                }
                pcVar44 = (char *)((long)&((gen_ctx_t)pcVar44)->ctx + 1);
              }
              else {
                if ((gen_ctx_t)pcVar44 == (gen_ctx_t)&DAT_00000001) break;
                pcVar44 = (char *)0x0;
                if (*(char *)&pgVar17->optimize_level != '\x02') goto LAB_00156041;
                uVar27 = *(uint *)&pgVar17->curr_func_item;
                pcVar44 = &DAT_00000001;
              }
              if (0x21 < uVar27) {
                pgVar42 = (gen_ctx_t)pVVar40->els_num;
                if (pgVar42 == (gen_ctx_t)0x0) goto LAB_0015630d;
                pVVar40->els_num = 0;
                pMVar15 = pgVar42->ctx;
                uVar4 = *(uint *)&pMVar15->field_0x1c;
                uVar20 = 0;
                auStack_190._24_8_ = pgVar42;
                auStack_190._32_8_ = pcVar44;
                do {
                  if (uVar4 <= uVar20) goto LAB_0015621c;
                  puVar33 = (uint *)((long)&pMVar15->temp_string + uVar20 * 0x30);
                  uVar38 = uVar20;
                  while( true ) {
                    pgStackY_1d8 = (gen_ctx_t)0x155fc2;
                    MIR_insn_op_mode(gen_ctx_00->ctx,(MIR_insn_t_conflict)pMVar15,uVar38,
                                     (int *)pgVar14);
                    pgVar32 = pgStack_140;
                    if ((auStack_190._0_4_ != 0) && ((char)puVar33[-2] != '\v')) break;
                    uVar38 = uVar38 + 1;
                    puVar33 = puVar33 + 0xc;
                    if (uVar4 == uVar38) goto LAB_0015621c;
                  }
                  if ((char)puVar33[-2] != '\x02') goto LAB_0015627d;
                  uVar20 = uVar38 + 1;
                } while (*puVar33 != uVar27);
                pgStackY_1d8 = (gen_ctx_t)0x15601d;
                pcVar35 = (char *)auStack_190._24_8_;
                pgVar37 = gen_ctx_00;
                add_ssa_edge_1(gen_ctx_00,(bb_insn_t_conflict)auStack_190._24_8_,(int)uVar38,
                               (bb_insn_t_conflict)auStack_164._4_8_,(int)pgStack_140,0);
                pgVar43 = pgStack_148;
                pcVar44 = (char *)auStack_190._32_8_;
              }
              if (pgVar43 <= pgVar32) goto LAB_00155e73;
            }
            pcVar44 = (char *)0x0;
LAB_00156041:
            pgVar32 = (gen_ctx_t)((long)&pgVar32->ctx + 1);
          } while (pgVar32 < pgVar43);
        }
LAB_00155e73:
        pbVar23 = ((DLIST_LINK_bb_insn_t *)(auStack_164._4_8_ + 0x20))->next;
      }
      pbVar22 = ((DLIST_LINK_bb_t *)(auStack_164._12_8_ + 0x20))->next;
    } while (pbVar22 != (bb_t)0x0);
  }
  if (iStack_168 == 0) {
    return (int)pbVar22;
  }
  psVar24 = gen_ctx_00->ssa_ctx;
  pVVar8 = psVar24->curr_reg_indexes;
  pgVar42 = gen_ctx_00;
  if ((pVVar8 != (VARR_size_t *)0x0) && (pVVar8->varr != (size_t *)0x0)) {
    pVVar8->els_num = 0;
    pbVar22 = (gen_ctx_00->curr_cfg->bbs).head;
    if (pbVar22 != (bb_t_conflict)0x0) {
      do {
        for (pbVar23 = (pbVar22->bb_insns).head; pbVar23 != (bb_insn_t)0x0;
            pbVar23 = (pbVar23->bb_insn_link).next) {
          pMVar31 = pbVar23->insn;
          uVar20 = *(ulong *)&pMVar31->field_0x18 >> 0x20;
          if (uVar20 != 0) {
            uVar38 = 0;
            nop = 0;
            do {
              while( true ) {
                pgStackY_1d8 = (gen_ctx_t)0x15611e;
                MIR_insn_op_mode(gen_ctx_00->ctx,pMVar31,nop,(int *)auStack_190);
                if ((auStack_190._0_4_ != 0) && (pMVar31->ops[nop].field_0x8 != '\v'))
                goto LAB_001561a2;
                if (1 < uVar38) break;
                cVar3 = pMVar31->ops[nop].field_0x8;
                if (cVar3 == '\v') {
                  while (uVar27 = *(uint *)((long)&pMVar31->ops[nop].u +
                                           (ulong)(uVar38 != 0) * 4 + 0x10), uVar27 == 0xffffffff) {
                    bVar47 = uVar38 != 0;
                    uVar38 = 1;
                    if (bVar47) goto LAB_001561a0;
                  }
                  uVar38 = uVar38 + 1;
                }
                else {
                  if (uVar38 == 1) break;
                  uVar38 = 0;
                  if (cVar3 != '\x02') goto LAB_001561a2;
                  uVar27 = pMVar31->ops[nop].u.reg;
                  uVar38 = 1;
                }
                if ((0x21 < uVar27) && (*(int *)&pMVar31->field_0x18 - 0x22U < 0xfffffffc)) {
                  *(undefined1 *)((long)pMVar31->ops[(int)nop].data + 0x10) = 0;
                }
                if (uVar20 <= nop) goto LAB_001561b0;
              }
LAB_001561a0:
              uVar38 = 0;
LAB_001561a2:
              nop = nop + 1;
            } while (nop < uVar20);
          }
LAB_001561b0:
        }
        pbVar22 = (pbVar22->bb_link).next;
      } while (pbVar22 != (bb_t)0x0);
      psVar24 = gen_ctx_00->ssa_ctx;
    }
    pVVar25 = psVar24->arg_bb_insns;
    if (pVVar25 != (VARR_bb_insn_t *)0x0) {
      uVar20 = 0;
      do {
        if (pVVar25->els_num <= uVar20) {
          pfVar26 = gen_ctx_00->curr_cfg;
          for (pbVar22 = (pfVar26->bbs).head; pbVar22 != (bb_t_conflict)0x0;
              pbVar22 = (pbVar22->bb_link).next) {
            for (pbVar23 = (pbVar22->bb_insns).head; pbVar23 != (bb_insn_t_conflict)0x0;
                pbVar23 = (pbVar23->bb_insn_link).next) {
              pgStackY_1d8 = (gen_ctx_t)0x15625f;
              rename_bb_insn(gen_ctx_00,pbVar23);
              pfVar26 = extraout_RAX;
            }
          }
          return (int)pfVar26;
        }
        if (pVVar25->varr == (bb_insn_t_conflict *)0x0) goto LAB_0015634a;
        pbVar19 = pVVar25->varr[uVar20];
        if (pbVar19 != (bb_insn_t_conflict)0x0) {
          pgStackY_1d8 = (gen_ctx_t)0x156205;
          rename_bb_insn(gen_ctx_00,pbVar19);
          pVVar25 = gen_ctx_00->ssa_ctx->arg_bb_insns;
        }
        uVar20 = uVar20 + 1;
      } while (pVVar25 != (VARR_bb_insn_t *)0x0);
    }
    pgStackY_1d8 = (gen_ctx_t)0x15621c;
    build_ssa_cold_7();
LAB_0015621c:
    pgStackY_1d8 = (gen_ctx_t)0x15623b;
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x9a4,"int get_var_def_op_num(gen_ctx_t, MIR_reg_t, MIR_insn_t)");
  }
  goto LAB_00156396;
LAB_00154d80:
  do {
    pbVar23 = (pbVar22->bb_insns).tail;
    if (pbVar23 == (bb_insn_t)0x0) {
      pgStack_110 = (gen_ctx_t)0x155584;
      __assert_fail("bb_insn != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x7de,"int clone_bbs(gen_ctx_t)");
    }
    if ((*(int *)&pbVar23->insn->field_0x18 == 0x76) &&
       (peVar5 = (pbVar22->out_edges).head, peVar5 != (out_edge_t)0x0)) {
      pVVar40 = pgVar17->temp_bitmap;
      if (pVVar40 == (bitmap_t)0x0) goto LAB_0015558e;
      uVar20 = peVar5->dst->index;
      if ((uVar20 < pVVar40->els_num << 6) &&
         ((pVVar40->varr[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)) {
        pVVar18 = pgVar17->data_flow_ctx->worklist;
        ppbVar12 = pVVar18->varr;
        if (ppbVar12 == (bb_t_conflict *)0x0) goto LAB_001555b7;
        sVar30 = pVVar18->els_num;
        uVar20 = sVar30 + 1;
        if (pVVar18->size < uVar20) {
          sVar30 = (uVar20 >> 1) + uVar20;
          pgStack_110 = (gen_ctx_t)0x154e19;
          ppbVar12 = (bb_t_conflict *)realloc(ppbVar12,sVar30 * 8);
          pVVar18->varr = ppbVar12;
          pVVar18->size = sVar30;
          sVar30 = pVVar18->els_num;
          uVar20 = sVar30 + 1;
          pgVar17 = local_d0;
        }
        pVVar18->els_num = uVar20;
        ppbVar12[sVar30] = pbVar22;
      }
    }
    pbVar22 = (pbVar22->bb_link).next;
  } while (pbVar22 != (bb_t)0x0);
  pVVar18 = pgVar17->data_flow_ctx->worklist;
  if (pVVar18 != (VARR_bb_t *)0x0) {
LAB_00154e54:
    bVar47 = true;
    local_d8 = (gen_ctx_t)((ulong)local_d8 & 0xffffffff00000000);
    pcVar44 = (char *)0x0;
    pVVar40 = (bitmap_t)pVVar18->els_num;
    pgVar14 = (gen_ctx_t)0x0;
LAB_00154e6d:
    if ((bitmap_t)pVVar18->els_num == (bitmap_t)0x0) {
LAB_001554e6:
      if (bVar47) {
        return 0;
      }
      pgStack_110 = (gen_ctx_t)0x1554f5;
      remove_unreachable_bbs(pgVar17);
      pgStack_110 = (gen_ctx_t)0x155505;
      enumerate_bbs((gen_ctx_t)(pgVar17->curr_cfg->bbs).head);
      return (int)local_d8;
    }
    ppbVar12 = pVVar18->varr;
    pVVar36 = (bitmap_t)pVVar18->els_num;
    do {
      if (pVVar36 < pVVar40) {
        if (ppbVar12 == (bb_t_conflict *)0x0) {
          pgStack_110 = (gen_ctx_t)0x155589;
          clone_bbs_cold_12();
          goto LAB_00155589;
        }
        pbVar23 = (ppbVar12[(long)((long)&pVVar36[-1].varr + 7)]->bb_insns).head;
        pVVar40 = pVVar36;
        if (pbVar23 != (bb_insn_t)0x0) {
          pgVar14 = (gen_ctx_t)0x0;
          do {
            pbVar23 = (pbVar23->bb_insn_link).next;
            pgVar14 = (gen_ctx_t)((long)&pgVar14->ctx + 1);
            pcVar44 = (char *)pgVar14;
          } while (pbVar23 != (bb_insn_t)0x0);
          goto LAB_00154eb5;
        }
        pgVar14 = (gen_ctx_t)0x0;
        pcVar44 = (char *)0x0;
      }
      else {
LAB_00154eb5:
        if (ppbVar12 == (bb_t_conflict *)0x0) {
          pgStack_110 = (gen_ctx_t)0x155546;
          clone_bbs_cold_4();
          goto LAB_00155546;
        }
      }
      pVVar1 = (bitmap_t)((long)&pVVar36[-1].varr + 7);
      pVVar18->els_num = (size_t)pVVar1;
      pgVar42 = (gen_ctx_t)ppbVar12[(long)((long)&pVVar36[-1].varr + 7)];
      pgVar32 = (gen_ctx_t)((DLIST_out_edge_t *)&pgVar42->addr_regs)->head;
      if ((bb_t)pgVar32->to_free != (bb_t)0x0) goto LAB_00155522;
      if (*(char *)((long)&((DLIST_in_edge_t *)&pgVar32->addr_insn_p)->head + 1) == '\0') {
        pbVar23 = (bb_insn_t)pgVar42->temp_bitmap2;
        if ((pbVar23 == (bb_insn_t)0x0) ||
           (pMVar34 = pbVar23->insn, *(int *)&pMVar34->field_0x18 != 0x76)) {
LAB_00155546:
          pgStack_110 = (gen_ctx_t)0x155565;
          __assert_fail("bb_insn != ((void*)0) && bb_insn->insn->code == MIR_JMP",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x7f0,"int clone_bbs(gen_ctx_t)");
        }
        puVar46 = *(undefined8 **)&pgVar32->optimize_level;
        local_c8 = *(MIR_context_t *)puVar46[0xb];
        if ((2 < local_c8->func_redef_permission_p - 0xaaU) &&
           (pcVar44 <= (gen_ctx_t)((long)pgVar14 * 3))) goto LAB_00154f3b;
      }
      pVVar36 = pVVar1;
      if (pVVar1 == (bitmap_t)0x0) goto LAB_001554e6;
    } while( true );
  }
LAB_001555bc:
  pgStack_110 = (gen_ctx_t)0x1555c1;
  clone_bbs_cold_3();
LAB_001555c1:
  pgStack_110 = (gen_ctx_t)0x1555c6;
  clone_bbs_cold_10();
LAB_001555c6:
  pgStack_110 = (gen_ctx_t)0x1555e5;
  __assert_fail("last_dst_insn != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x810,"int clone_bbs(gen_ctx_t)");
  while( true ) {
    pMVar28 = ((gen_ctx_t)pcVar44)->ctx;
    pMVar15 = (MIR_context_t)((long)&pMVar28->gen_ctx + 1);
    if (*(MIR_context_t *)&((gen_ctx_t)pcVar44)->optimize_level < pMVar15) {
      pgVar42 = (gen_ctx_t)((long)&pMVar15->gen_ctx + ((ulong)pMVar15 >> 1));
      pcVar35 = (char *)((long)pgVar42 * 8);
      pgStackY_1d8 = (gen_ctx_t)0x1556e9;
      pgVar37 = pgVar17;
      pgVar17 = (gen_ctx_t)realloc(pgVar17,(size_t)pcVar35);
      ((gen_ctx_t)pcVar44)->curr_func_item = (MIR_item_t)pgVar17;
      *(gen_ctx_t *)&((gen_ctx_t)pcVar44)->optimize_level = pgVar42;
      pMVar28 = ((gen_ctx_t)pcVar44)->ctx;
      pMVar15 = (MIR_context_t)((long)&pMVar28->gen_ctx + 1);
    }
    ((gen_ctx_t)pcVar44)->ctx = pMVar15;
    pgVar17->call_used_hard_regs[(long)((long)&pMVar28[-1].setjmp_addr + 3)] = (bitmap_t)pgVar14;
    pgVar14 = (gen_ctx_t)pgVar14->to_free;
    if (pgVar14 == (gen_ctx_t)0x0) break;
LAB_001556ac:
    pcVar44 = (char *)gen_ctx_00->data_flow_ctx->worklist;
    pgVar17 = (gen_ctx_t)((gen_ctx_t)pcVar44)->curr_func_item;
    if (pgVar17 == (gen_ctx_t)0x0) goto LAB_00156340;
  }
  pVVar18 = gen_ctx_00->data_flow_ctx->worklist;
  pgVar14 = (gen_ctx_t)0x0;
  if (pVVar18 != (VARR_bb_t *)0x0) {
LAB_0015571b:
    pcVar35 = (char *)pVVar18->els_num;
    pgVar37 = (gen_ctx_t)pVVar18->varr;
    pgStackY_1d8 = (gen_ctx_t)0x155733;
    qsort(pgVar37,(size_t)pcVar35,8,rpost_cmp);
    pVVar25 = gen_ctx_00->ssa_ctx->phis;
    if ((pVVar25 == (VARR_bb_insn_t *)0x0) || (pVVar25->varr == (bb_insn_t_conflict *)0x0)) {
LAB_00156373:
      pgStackY_1d8 = (gen_ctx_t)0x156378;
      build_ssa_cold_21();
    }
    else {
      pVVar25->els_num = 0;
      pVVar18 = gen_ctx_00->data_flow_ctx->worklist;
      if (pVVar18 != (VARR_bb_t *)0x0) {
        pgVar17 = (gen_ctx_t)0x0;
        lStack_198 = 0;
        do {
          if ((gen_ctx_t)pVVar18->els_num <= pgVar17) goto LAB_001559b4;
          if (pVVar18->varr == (bb_t_conflict *)0x0) goto LAB_00156331;
          pbVar23 = (pVVar18->varr[(long)pgVar17]->bb_insns).head;
          pgVar45 = pgVar17;
          if (pbVar23 != (bb_insn_t_conflict)0x0) {
            do {
              auStack_190._24_8_ = pgVar45;
              pgVar45 = (gen_ctx_t)pbVar23->insn;
              pgVar43 = (gen_ctx_t)pgVar45->debug_file;
              if ((int)pgVar43 != 0xba) {
                pMVar15 = (MIR_context_t)pbVar23->bb;
                pgVar43 = (gen_ctx_t)((ulong)pgVar43 >> 0x20);
                pgVar32 = pgVar45;
                if (pgVar43 != (gen_ctx_t)0x0) {
                  pgVar42 = (gen_ctx_t)0x0;
                  pgVar14 = (gen_ctx_t)0x0;
                  auStack_190._32_8_ = &pgVar45->debug_level;
                  do {
                    uVar10 = auStack_190._32_8_;
                    while( true ) {
                      pgVar37 = (gen_ctx_t)gen_ctx_00->ctx;
                      pgStackY_1d8 = (gen_ctx_t)0x155818;
                      pcVar35 = (char *)pgVar45;
                      MIR_insn_op_mode((MIR_context_t)pgVar37,(MIR_insn_t_conflict)pgVar45,
                                       (size_t)pgVar14,(int *)auStack_190);
                      if ((auStack_190._0_4_ != 0) &&
                         (*(char *)((_IO_FILE **)(uVar10 + 0x68) + (long)pgVar14 * 6 + -0xc) != '\v'
                         )) goto LAB_001558bd;
                      if ((gen_ctx_t)&DAT_00000001 < pgVar42) break;
                      if (*(char *)((_IO_FILE **)(uVar10 + 0x68) + (long)pgVar14 * 6 + -0xc) == '\v'
                         ) {
                        while (uVar27 = *(uint *)((long)(uVar10 + 0x68) +
                                                 (ulong)(pgVar42 != (gen_ctx_t)0x0) * 4 +
                                                 (long)pgVar14 * 0x30 + -0x48),
                              pcVar35 = (char *)(ulong)uVar27, uVar27 == 0xffffffff) {
                          bVar47 = pgVar42 != (gen_ctx_t)0x0;
                          pgVar42 = (gen_ctx_t)&DAT_00000001;
                          if (bVar47) goto LAB_001558ba;
                        }
                        pgVar42 = (gen_ctx_t)((long)&pgVar42->ctx + 1);
                      }
                      else {
                        if (pgVar42 == (gen_ctx_t)&DAT_00000001) break;
                        pgVar42 = (gen_ctx_t)0x0;
                        if (*(char *)((_IO_FILE **)(uVar10 + 0x68) + (long)pgVar14 * 6 + -0xc) !=
                            '\x02') goto LAB_001558bd;
                        pcVar35 = (char *)(ulong)*(uint *)((_IO_FILE **)(uVar10 + 0x68) +
                                                          (long)pgVar14 * 6 + -0xb);
                        pgVar42 = (gen_ctx_t)&DAT_00000001;
                      }
                      if ((MIR_reg_t)pcVar35 < 0x22) {
                        pgStackY_1d8 = (gen_ctx_t)0x1562bb;
                        __assert_fail("var > ST1_HARD_REG",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0xa4d,"void process_bb_insn_for_ssa(gen_ctx_t, bb_insn_t)");
                      }
                      pgStackY_1d8 = (gen_ctx_t)0x155895;
                      pgVar37 = gen_ctx_00;
                      pbVar19 = get_def(gen_ctx_00,(MIR_reg_t)pcVar35,(bb_t_conflict)pMVar15);
                      pgVar32 = (gen_ctx_t)pbVar23->insn;
                      pgVar32->call_used_hard_regs[(long)(int)pgVar14 * 6 + -9] = (bitmap_t)pbVar19;
                      if (pgVar43 <= pgVar14) goto LAB_001558d1;
                    }
LAB_001558ba:
                    pgVar42 = (gen_ctx_t)0x0;
LAB_001558bd:
                    pgVar14 = (gen_ctx_t)((long)&pgVar14->ctx + 1);
                  } while (pgVar14 < pgVar43);
                  pgVar32 = (gen_ctx_t)pbVar23->insn;
                }
LAB_001558d1:
                pgVar43 = (gen_ctx_t)auStack_164;
                pcVar44 = (char *)((ulong)pgVar32->debug_file >> 0x20);
                if ((gen_ctx_t)pcVar44 != (gen_ctx_t)0x0) {
                  pgVar42 = (gen_ctx_t)&pgVar32->debug_level;
                  pgVar14 = (gen_ctx_t)0x0;
                  do {
                    pgVar37 = (gen_ctx_t)gen_ctx_00->ctx;
                    pgStackY_1d8 = (gen_ctx_t)0x1558fc;
                    pcVar35 = (char *)pgVar32;
                    MIR_insn_op_mode((MIR_context_t)pgVar37,(MIR_insn_t_conflict)pgVar32,
                                     (size_t)pgVar14,(int *)pgVar43);
                    if (auStack_164._0_4_ != 0) {
                      if (*(char *)(pgVar32->call_used_hard_regs + (long)pgVar14 * 6 + -8) == '\x02'
                         ) {
                        pcVar35 = &DAT_00000002;
                        auStack_190._8_4_ =
                             *(undefined4 *)
                              &((DLIST_LINK_bb_t *)((long)pgVar42 + ((long)pgVar14 * 3 + 1) * 0x10))
                               ->prev;
                        pgVar37 = (gen_ctx_t)gen_ctx_00->ssa_ctx->def_tab;
                        el._12_4_ = auStack_190._12_4_;
                        el.reg = auStack_190._8_4_;
                        pgStackY_1d8 = (gen_ctx_t)0x155974;
                        el.bb = (bb_t_conflict)pMVar15;
                        el.def = pbVar23;
                        auStack_190._0_8_ = pMVar15;
                        auStack_190._16_8_ = pbVar23;
                        HTAB_def_tab_el_t_do
                                  ((HTAB_def_tab_el_t *)pgVar37,el,HTAB_REPLACE,
                                   (def_tab_el_t *)auStack_190);
                      }
                      else if (*(char *)(pgVar32->call_used_hard_regs + (long)pgVar14 * 6 + -8) !=
                               '\v') {
LAB_0015627d:
                        pgStackY_1d8 = (gen_ctx_t)0x15629c;
                        __assert_fail("op_ref->mode == MIR_OP_VAR",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x4ff,
                                      "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                                     );
                      }
                    }
                    pgVar14 = (gen_ctx_t)((long)&pgVar14->ctx + 1);
                  } while (pgVar14 < pcVar44);
                }
                lStack_198 = lStack_198 + 1;
                pgVar17 = (gen_ctx_t)auStack_190._24_8_;
              }
              pbVar23 = (pbVar23->bb_insn_link).next;
              pgVar45 = (gen_ctx_t)auStack_190._24_8_;
            } while (pbVar23 != (bb_insn_t)0x0);
            pVVar18 = gen_ctx_00->data_flow_ctx->worklist;
          }
          pgVar17 = (gen_ctx_t)((long)&pgVar17->ctx + 1);
        } while (pVVar18 != (VARR_bb_t *)0x0);
      }
      pgStackY_1d8 = (gen_ctx_t)0x1559b4;
      build_ssa_cold_20();
LAB_001559b4:
      psVar24 = gen_ctx_00->ssa_ctx;
      pVVar25 = psVar24->phis;
      if (pVVar25 != (VARR_bb_insn_t *)0x0) {
        pgVar14 = (gen_ctx_t)0x0;
        do {
          if ((gen_ctx_t)pVVar25->els_num <= pgVar14) goto LAB_00155a31;
          if (pVVar25->varr == (bb_insn_t_conflict *)0x0) goto LAB_00156336;
          pcVar44 = (char *)pVVar25->varr[(long)pgVar14];
          pgVar42 = *(gen_ctx_t *)
                     &((DLIST_in_edge_t *)&((gen_ctx_t)pcVar44)->addr_insn_p)->head->fall_through_p;
          if (pgVar42 != (gen_ctx_t)0x0) {
            pgVar43 = (gen_ctx_t)0x50;
            uVar27 = *(uint *)&((gen_ctx_t)pcVar44)->ctx->temp_string;
            pgVar32 = (gen_ctx_t)(ulong)uVar27;
            do {
              pcVar35 = (char *)(ulong)uVar27;
              pgStackY_1d8 = (gen_ctx_t)0x155a04;
              pgVar37 = gen_ctx_00;
              pbVar19 = get_def(gen_ctx_00,uVar27,(bb_t_conflict)pgVar42->ctx);
              *(bb_insn_t_conflict *)((long)&((gen_ctx_t)pcVar44)->ctx->gen_ctx + (long)pgVar43) =
                   pbVar19;
              pgVar43 = (gen_ctx_t)((long)pgVar43 + 0x30);
              pgVar42 = (gen_ctx_t)pgVar42->debug_file;
            } while (pgVar42 != (gen_ctx_t)0x0);
            psVar24 = gen_ctx_00->ssa_ctx;
            pgVar42 = (gen_ctx_t)0x0;
          }
          pVVar25 = psVar24->phis;
          pgVar14 = (gen_ctx_t)((long)&pgVar14->ctx + 1);
        } while (pVVar25 != (VARR_bb_insn_t *)0x0);
      }
      pgStackY_1d8 = (gen_ctx_t)0x155a31;
      build_ssa_cold_18();
LAB_00155a31:
      pVVar25 = psVar24->deleted_phis;
      if ((pVVar25 != (VARR_bb_insn_t *)0x0) && (pVVar25->varr != (bb_insn_t_conflict *)0x0)) {
        pVVar25->els_num = 0;
LAB_00155a50:
        pVVar25 = psVar24->phis;
        if (pVVar25 == (VARR_bb_insn_t *)0x0) {
LAB_001562c0:
          pgStackY_1d8 = (gen_ctx_t)0x1562c5;
          build_ssa_cold_15();
LAB_001562c5:
          pgStackY_1d8 = (gen_ctx_t)0x1562ca;
          build_ssa_cold_14();
LAB_001562ca:
          pgStackY_1d8 = (gen_ctx_t)0x1562e9;
          __assert_fail("phi->insn->ops[0].mode == MIR_OP_VAR",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x8b0,"bb_insn_t redundant_phi_def(gen_ctx_t, bb_insn_t, int *)");
        }
        pgVar43 = (gen_ctx_t)0x0;
        pcVar44 = (char *)0x0;
        pgVar14 = (gen_ctx_t)0x0;
        while( true ) {
          pcVar35 = (char *)pVVar25->els_num;
          ppbVar21 = pVVar25->varr;
          if (pcVar35 <= pgVar14) break;
          if (ppbVar21 == (bb_insn_t_conflict *)0x0) goto LAB_001562c5;
          pgVar42 = (gen_ctx_t)ppbVar21[(long)pgVar14];
          pMVar15 = pgVar42->ctx;
          if (*(ulong *)&pMVar15->func_redef_permission_p >> 0x21 == 0) {
            if (*(char *)&pMVar15->unspec_protos != '\x02') goto LAB_001562ca;
LAB_00155b30:
            pgStackY_1d8 = (gen_ctx_t)0x155b3f;
            pgVar17 = (gen_ctx_t)
                      get_fake_insn(gen_ctx_00,psVar24->undef_insns,
                                    *(MIR_reg_t *)&((DLIST_in_edge_t *)&pMVar15->temp_string)->head)
            ;
            if (pgVar17 != (gen_ctx_t)0x0) {
              pMVar15 = pgVar42->ctx;
              goto LAB_00155b48;
            }
            psVar24 = gen_ctx_00->ssa_ctx;
LAB_00155bbb:
            pVVar25 = psVar24->phis;
            if (((pVVar25 == (VARR_bb_insn_t *)0x0) || (pVVar25->varr == (bb_insn_t_conflict *)0x0))
               || ((gen_ctx_t)pVVar25->els_num <= pcVar44)) {
              pgStackY_1d8 = (gen_ctx_t)0x1562c0;
              build_ssa_cold_13();
              goto LAB_001562c0;
            }
            ppbVar21 = pVVar25->varr + (long)pcVar44;
            pcVar44 = (char *)((long)&((gen_ctx_t)pcVar44)->ctx + 1);
          }
          else {
            uVar20 = *(ulong *)&pMVar15->func_redef_permission_p >> 0x20;
            uVar38 = 1;
            do {
              lVar39 = uVar38 * 3;
              pbVar7 = ((DLIST_LINK_bb_t *)&pMVar15->insn_nops)[uVar38 * 3].prev;
              do {
                pbVar41 = pbVar7;
                if (*(int *)(pbVar41->index + 0x18) != 0xba) break;
                pbVar7 = *(bb_t *)(pbVar41->index + 0x20);
              } while (pbVar41 != pbVar7);
              uVar38 = uVar38 + 1;
              ((DLIST_LINK_bb_t *)&pMVar15->insn_nops)[lVar39].prev = pbVar41;
            } while (uVar38 != uVar20);
            lVar39 = 0x30;
            pgVar17 = (gen_ctx_t)0x0;
            do {
              pgVar37 = *(gen_ctx_t *)
                         ((long)&((DLIST_LINK_bb_t *)&pMVar15->insn_nops)->prev + lVar39);
              if ((pgVar37 != pgVar42 && pgVar37 != pgVar17) &&
                 (bVar47 = pgVar17 != (gen_ctx_t)0x0, pgVar17 = pgVar37, bVar47)) goto LAB_00155bbb;
              lVar39 = lVar39 + 0x30;
            } while (uVar20 * 0x30 != lVar39);
            if (*(char *)&pMVar15->unspec_protos != '\x02') goto LAB_001562ca;
            if (pgVar17 == (gen_ctx_t)0x0) goto LAB_00155b30;
LAB_00155b48:
            ((DLIST_LINK_bb_t *)&pMVar15->insn_nops)->prev = (bb_t)pgVar17;
            if (pgVar42 == pgVar17) {
              pgStackY_1d8 = (gen_ctx_t)0x156308;
              __assert_fail("phi != def",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x912,"void minimize_ssa(gen_ctx_t, size_t)");
            }
            pVVar25 = gen_ctx_00->ssa_ctx->deleted_phis;
            ppbVar21 = pVVar25->varr;
            if (ppbVar21 == (bb_insn_t_conflict *)0x0) {
              pgStackY_1d8 = (gen_ctx_t)0x15630d;
              build_ssa_cold_12();
LAB_0015630d:
              pgStackY_1d8 = (gen_ctx_t)0x15632c;
              __assert_fail("def != ((void*)0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x9b2,
                            "void process_insn_inputs_for_ssa_def_use_repr(gen_ctx_t, bb_insn_t)");
            }
            sVar30 = pVVar25->els_num;
            uVar20 = sVar30 + 1;
            if (pVVar25->size < uVar20) {
              pgVar32 = (gen_ctx_t)((uVar20 >> 1) + uVar20);
              pgStackY_1d8 = (gen_ctx_t)0x155b94;
              ppbVar21 = (bb_insn_t_conflict *)realloc(ppbVar21,(long)pgVar32 * 8);
              pVVar25->varr = ppbVar21;
              pVVar25->size = (size_t)pgVar32;
              sVar30 = pVVar25->els_num;
              uVar20 = sVar30 + 1;
            }
            ppbVar21 = ppbVar21 + sVar30;
            pVVar25->els_num = uVar20;
            pgVar43 = (gen_ctx_t)&DAT_00000001;
          }
          *ppbVar21 = (bb_insn_t_conflict)pgVar42;
          pgVar14 = (gen_ctx_t)((long)&pgVar14->ctx + 1);
          psVar24 = gen_ctx_00->ssa_ctx;
          pVVar25 = psVar24->phis;
          if (pVVar25 == (VARR_bb_insn_t *)0x0) goto LAB_001562c0;
        }
        if ((ppbVar21 != (bb_insn_t_conflict *)0x0) && (pcVar44 <= pcVar35)) goto code_r0x00155c16;
        pgStackY_1d8 = (gen_ctx_t)0x156331;
        build_ssa_cold_11();
LAB_00156331:
        pgStackY_1d8 = (gen_ctx_t)0x156336;
        build_ssa_cold_19();
LAB_00156336:
        pgStackY_1d8 = (gen_ctx_t)0x15633b;
        build_ssa_cold_17();
        goto LAB_0015633b;
      }
    }
    pgStackY_1d8 = (gen_ctx_t)0x15637d;
    build_ssa_cold_16();
    pgVar17 = gen_ctx_00;
LAB_0015637d:
    pgStackY_1d8 = (gen_ctx_t)0x156382;
    build_ssa_cold_24();
LAB_00156382:
    gen_ctx_00 = pgVar17;
    pgStackY_1d8 = (gen_ctx_t)0x156387;
    build_ssa_cold_23();
    goto LAB_00156387;
  }
LAB_0015638c:
  pgStackY_1d8 = (gen_ctx_t)0x156391;
  build_ssa_cold_1();
LAB_00156391:
  pgStackY_1d8 = (gen_ctx_t)0x156396;
  build_ssa_cold_5();
LAB_00156396:
  pgStackY_1d8 = (gen_ctx_t)0x15639b;
  build_ssa_cold_8();
LAB_0015639b:
  pgStackY_1d8 = (gen_ctx_t)print_varr_insns;
  build_ssa_cold_3();
  pgVar17 = (gen_ctx_t)pgVar37->debug_file;
  pgStackY_200 = (gen_ctx_t)0x1563c4;
  pgStackY_1f8 = gen_ctx_00;
  pgStackY_1f0 = pgVar42;
  pgStackY_1e8 = pgVar43;
  pgStackY_1e0 = pgVar14;
  pgStackY_1d8 = (gen_ctx_t)pcVar44;
  iVar11 = fprintf((FILE *)pgVar17,"%s insns:\n",pcVar35);
  if (extraout_RDX == (long *)0x0) {
LAB_00156425:
    pgStackY_200 = (gen_ctx_t)undo_build_ssa;
    print_varr_insns_cold_2();
    pgStackY_220 = pgVar42;
    pgStackY_218 = pgVar43;
    pgStackY_210 = pgVar37;
    pgStackY_208 = (gen_ctx_t)pcVar44;
    pgStackY_200 = pgVar32;
    free_fake_bb_insns(pgVar17->ssa_ctx->arg_bb_insns);
    free_fake_bb_insns(pgVar17->ssa_ctx->undef_insns);
    pbVar22 = (pgVar17->curr_cfg->bbs).head;
    if (pbVar22 != (bb_t_conflict)0x0) {
      pgStackY_230 = pgVar17;
      do {
        pbStackY_240 = pbVar22;
        for (pbVar23 = (pbVar22->bb_insns).head; pbVar23 != (bb_insn_t)0x0;
            pbVar23 = (pbVar23->bb_insn_link).next) {
          pMVar31 = pbVar23->insn;
          uVar20 = *(ulong *)&pMVar31->field_0x18 >> 0x20;
          if (uVar20 != 0) {
            sVar30 = 0;
            pbStackY_238 = pbVar23;
LAB_001564a7:
            do {
              MIR_insn_op_mode(pgVar17->ctx,pMVar31,sVar30,&iStackY_244);
              if (iStackY_244 != 0) {
                cVar3 = pMVar31->ops[sVar30].field_0x8;
                if (cVar3 == '\x02') {
                  __ptr = pMVar31->ops[(int)sVar30].data;
                  pgVar17 = pgStackY_230;
                  while (pgStackY_230 = pgVar17, __ptr != (void *)0x0) {
                    pvVar9 = *(void **)((long)__ptr + 0x20);
                    free(__ptr);
                    __ptr = pvVar9;
                    pgVar17 = pgStackY_230;
                  }
                  sVar30 = sVar30 + 1;
                  if (uVar20 <= sVar30) break;
                  goto LAB_001564a7;
                }
                if (cVar3 != '\v') {
                  __assert_fail("op_ref->mode == MIR_OP_VAR",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x4ff,
                                "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                               );
                }
              }
              sVar30 = sVar30 + 1;
            } while (sVar30 < uVar20);
            auVar48 = vpbroadcastq_avx512f(ZEXT816(0x30));
            auVar49 = vpbroadcastq_avx512f(ZEXT816(8));
            uVar20 = *(ulong *)&pMVar31->field_0x18 >> 0x20;
            pbVar23 = pbStackY_238;
            if (uVar20 != 0) {
              auVar50 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              uVar20 = uVar20 + 7 & 0xfffffffffffffff8;
              auVar51 = vpbroadcastq_avx512f();
              do {
                auVar52 = vpmullq_avx512dq(auVar50,auVar48);
                uVar10 = vpcmpuq_avx512f(auVar50,auVar51,2);
                auVar50 = vpaddq_avx512f(auVar50,auVar49);
                uVar20 = uVar20 - 8;
                vpscatterqq_avx512f(ZEXT864(pMVar31->ops) + ZEXT864(0) + auVar52,uVar10,
                                    ZEXT1664((undefined1  [16])0x0));
              } while (uVar20 != 0);
            }
          }
        }
        pbVar22 = (pbStackY_240->bb_link).next;
      } while (pbVar22 != (bb_t)0x0);
      pbVar22 = (bb_t_conflict)pgVar17->curr_cfg;
      for (sVar30 = pbVar22->bfs; sVar30 != 0; sVar30 = *(size_t *)(sVar30 + 0x28)) {
        puVar46 = *(undefined8 **)(sVar30 + 0x50);
        while (puVar46 != (undefined8 *)0x0) {
          pMVar34 = (MIR_insn_t)*puVar46;
          puVar46 = (undefined8 *)puVar46[5];
          if (*(int *)&pMVar34->field_0x18 == 0xba) {
            gen_delete_insn(pgVar17,pMVar34);
            pbVar22 = extraout_RAX_01;
          }
        }
      }
    }
    return (int)pbVar22;
  }
  if (*extraout_RDX != 0) {
    pcVar44 = "  %-5lu";
    pgVar43 = (gen_ctx_t)0x0;
    do {
      lVar39 = extraout_RDX[2];
      if (lVar39 == 0) {
        pgStackY_200 = (gen_ctx_t)0x156425;
        print_varr_insns_cold_1();
        goto LAB_00156425;
      }
      pgVar42 = *(gen_ctx_t *)(lVar39 + (long)pgVar43 * 8);
      if (pgVar42 != (gen_ctx_t)0x0) {
        pgStackY_200 = (gen_ctx_t)0x1563fe;
        fprintf((FILE *)pgVar37->debug_file,"  %-5lu",(ulong)*(uint *)&pgVar42->field_0xc);
        pgStackY_200 = (gen_ctx_t)0x15640e;
        pgVar17 = pgVar37;
        print_bb_insn(pgVar37,(bb_insn_t_conflict)pgVar42,1);
        lVar39 = extraout_RAX_00;
      }
      iVar11 = (int)lVar39;
      pgVar43 = (gen_ctx_t)((long)&pgVar43->ctx + 1);
    } while (pgVar43 < (gen_ctx_t)*extraout_RDX);
  }
  return iVar11;
}

Assistant:

static int clone_bbs (gen_ctx_t gen_ctx) {
  const int max_bb_growth_factor = 3;
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_insn_t dst_insn, last_dst_insn, new_insn, label, next_insn, after;
  bb_t bb, dst, new_bb;
  edge_t e;
  bb_insn_t bb_insn, dst_bb_insn, next_bb_insn;
  MIR_func_t func = curr_func_item->u.func;
  size_t size, orig_size, len, last_orig_bound;
  int res;

  gen_assert (optimize_level != 0);
  bitmap_clear (temp_bitmap);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bitmap_set_bit_p (temp_bitmap, bb->index);
    if ((bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns)) == NULL) continue;
    if (bb_insn->insn->code == MIR_RET || bb_insn->insn->code == MIR_JRET) break;
  }
  if (bb == NULL) return FALSE;
  VARR_TRUNC (bb_t, worklist, 0);
  for (bb = DLIST_NEXT (bb_t, bb); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns);
    gen_assert (bb_insn != NULL);
    if (bb_insn->insn->code == MIR_JMP && (e = DLIST_HEAD (out_edge_t, bb->out_edges)) != NULL
        && bitmap_bit_p (temp_bitmap, e->dst->index))
      VARR_PUSH (bb_t, worklist, bb);
  }
  res = FALSE;
  last_orig_bound = VARR_LENGTH (bb_t, worklist);
  orig_size = size = 0;
  while ((len = VARR_LENGTH (bb_t, worklist)) != 0) {
    if (last_orig_bound > len) {
      last_orig_bound = len;
      orig_size = size = DLIST_LENGTH (bb_insn_t, VARR_LAST (bb_t, worklist)->bb_insns);
    }
    bb = VARR_POP (bb_t, worklist);
    e = DLIST_HEAD (out_edge_t, bb->out_edges);
    gen_assert (DLIST_NEXT (out_edge_t, e) == NULL);
    if (e->back_edge_p) continue;
    bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns);
    gen_assert (bb_insn != NULL && bb_insn->insn->code == MIR_JMP);
    dst = e->dst;
    dst_bb_insn = DLIST_TAIL (bb_insn_t, dst->bb_insns);
    if (dst_bb_insn->insn->code == MIR_RET || dst_bb_insn->insn->code == MIR_JRET
        || dst_bb_insn->insn->code == MIR_SWITCH || size > max_bb_growth_factor * orig_size)
      continue;
    res = TRUE;
    DEBUG (2, {
      fprintf (debug_file, "  Cloning from BB%lu into BB%lu:\n", (unsigned long) dst->index,
               (unsigned long) bb->index);
    });
    last_dst_insn = DLIST_TAIL (bb_insn_t, dst->bb_insns)->insn;
    after = DLIST_PREV (MIR_insn_t, bb_insn->insn);
    gen_delete_insn (gen_ctx, bb_insn->insn);
    bb_insn = NULL;
    for (dst_bb_insn = DLIST_HEAD (bb_insn_t, dst->bb_insns); dst_bb_insn != NULL;
         dst_bb_insn = DLIST_NEXT (bb_insn_t, dst_bb_insn)) {
      dst_insn = dst_bb_insn->insn;
      if (dst_insn->code == MIR_LABEL) continue;
      new_insn = MIR_copy_insn (ctx, dst_insn);
      /* we can not use gen_add_insn_xxx becuase of some cases (e.g. bb_insn is the last insn): */
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      add_new_bb_insn (gen_ctx, new_insn, bb, TRUE);
      after = new_insn;
      DEBUG (2, {
        fprintf (debug_file, "  Adding insn %-5lu",
                 (unsigned long) ((bb_insn_t) new_insn->data)->index);
        MIR_output_insn (ctx, debug_file, new_insn, func, TRUE);
      });
      size++;
    }
    delete_edge (e);
    gen_assert (last_dst_insn != NULL);
    if (last_dst_insn->code == MIR_JMP) {
      label = last_dst_insn->ops[0].u.label;
      create_edge (gen_ctx, bb, ((bb_insn_t) label->data)->bb, FALSE, TRUE);
      if (bitmap_bit_p (temp_bitmap, ((bb_insn_t) label->data)->index))
        VARR_PUSH (bb_t, worklist, bb);
    } else if (!MIR_branch_code_p (last_dst_insn->code)) {
      next_insn = DLIST_NEXT (MIR_insn_t, last_dst_insn);
      next_bb_insn = next_insn->data;
      gen_assert (next_insn->code == MIR_LABEL);
      new_insn = MIR_new_insn (ctx, MIR_JMP, MIR_new_label_op (ctx, next_insn));
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      add_new_bb_insn (gen_ctx, new_insn, bb, TRUE);
      if (bitmap_bit_p (temp_bitmap, next_bb_insn->index)) VARR_PUSH (bb_t, worklist, bb);
      create_edge (gen_ctx, bb, ((bb_insn_t) next_insn->data)->bb, FALSE, TRUE);
    } else {
      label = get_insn_label (gen_ctx, DLIST_NEXT (MIR_insn_t, last_dst_insn)); /* fallthrough */
      new_insn = MIR_new_insn (ctx, MIR_JMP, MIR_new_label_op (ctx, label));
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      new_bb = create_bb (gen_ctx, new_insn);
      insert_new_bb_after (gen_ctx, bb, new_bb);
      if (bitmap_bit_p (temp_bitmap, ((bb_insn_t) label->data)->bb->index))
        VARR_PUSH (bb_t, worklist, new_bb);
      create_edge (gen_ctx, bb, new_bb, TRUE, TRUE); /* fall through */
      create_edge (gen_ctx, bb, ((bb_insn_t) last_dst_insn->ops[0].u.label->data)->bb, FALSE,
                   TRUE); /* branch */
      create_edge (gen_ctx, new_bb, ((bb_insn_t) label->data)->bb, FALSE, TRUE);
    }
    DEBUG (2, {
      fprintf (debug_file, "  Result BB%lu:\n", (unsigned long) bb->index);
      output_in_edges (gen_ctx, bb);
      output_out_edges (gen_ctx, bb);
      for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
           bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
        fprintf (debug_file, "  %-5lu", (unsigned long) bb_insn->index);
        MIR_output_insn (ctx, debug_file, bb_insn->insn, func, TRUE);
      }
    });
  }
  if (res) {
    remove_unreachable_bbs (gen_ctx);
    enumerate_bbs (gen_ctx);
  }
  return res;
}